

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall TPZEqnArray<std::complex<float>_>::Reset(TPZEqnArray<std::complex<float>_> *this)

{
  TPZStack<int,_100> *in_RDI;
  int64_t in_stack_00000018;
  TPZManVector<int,_1000> *in_stack_00000020;
  int64_t in_stack_00000058;
  TPZManVector<std::complex<float>,_1000> *in_stack_00000060;
  int in_stack_ffffffffffffffec;
  
  TPZManVector<int,_100>::Resize((TPZManVector<int,_100> *)in_stack_00000020,in_stack_00000018);
  TPZStack<int,_100>::Push(in_RDI,in_stack_ffffffffffffffec);
  TPZManVector<std::complex<float>,_1000>::Resize(in_stack_00000060,in_stack_00000058);
  TPZManVector<int,_1000>::Resize(in_stack_00000020,in_stack_00000018);
  *(undefined4 *)((long)&(in_RDI->super_TPZManVector<int,_100>).super_TPZVec<int>._vptr_TPZVec + 4)
       = 0;
  in_RDI[0x1d].super_TPZManVector<int,_100>.fExtAlloc[0x5e] = 0;
  *(undefined4 *)&(in_RDI->super_TPZManVector<int,_100>).super_TPZVec<int>._vptr_TPZVec = 0;
  return;
}

Assistant:

void TPZEqnArray<TVar>::Reset(){
	fEqStart.Resize(0);
	fEqStart.Push(0);
	fEqValues.Resize(0);
	fIndex.Resize(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}